

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

void Vec_IntFillExtra(Vec_Int_t *p,int nSize,int Fill)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  
  if (nSize <= p->nSize) {
    return;
  }
  iVar1 = p->nCap;
  iVar4 = iVar1 * 2;
  if (iVar4 < nSize) {
    if (nSize <= iVar1) goto LAB_008e81c6;
    if (p->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((long)nSize << 2);
    }
    else {
      piVar3 = (int *)realloc(p->pArray,(long)nSize << 2);
    }
    p->pArray = piVar3;
    iVar4 = nSize;
  }
  else {
    if (nSize <= iVar1) goto LAB_008e81c6;
    if (p->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((long)iVar1 << 3);
    }
    else {
      piVar3 = (int *)realloc(p->pArray,(long)iVar1 << 3);
    }
    p->pArray = piVar3;
  }
  if (piVar3 == (int *)0x0) {
    __assert_fail("p->pArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
  }
  p->nCap = iVar4;
LAB_008e81c6:
  uVar2 = p->nSize;
  if ((int)uVar2 < nSize) {
    memset(p->pArray + (int)uVar2,0,(ulong)(~uVar2 + nSize) * 4 + 4);
  }
  p->nSize = nSize;
  return;
}

Assistant:

static inline void Vec_IntFillExtra( Vec_Int_t * p, int nSize, int Fill )
{
    int i;
    if ( nSize <= p->nSize )
        return;
    if ( nSize > 2 * p->nCap )
        Vec_IntGrow( p, nSize );
    else if ( nSize > p->nCap )
        Vec_IntGrow( p, 2 * p->nCap );
    for ( i = p->nSize; i < nSize; i++ )
        p->pArray[i] = Fill;
    p->nSize = nSize;
}